

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O3

int main(int argc,char **argv)

{
  rx__test_case_desc *prVar1;
  rx_size rVar2;
  rx_failure *prVar3;
  long lVar4;
  int iVar5;
  rx_status rVar6;
  rx__test_case_desc **c_it;
  rx__test_case_desc **pprVar7;
  void *__base;
  void *__ptr;
  undefined8 *puVar8;
  char *pcVar9;
  int *piVar10;
  ulong uVar11;
  long lVar12;
  rx_test_case *prVar13;
  rx_test_case *file;
  char *pcVar14;
  long lVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  rx__test_suite_desc **pprVar19;
  rx_summary *summary;
  char *__nmemb;
  char *pcVar20;
  char *local_50;
  char *local_48;
  rx__fixture_desc *prStack_40;
  size_t local_38;
  
  pprVar7 = &rx__dummy_case;
  __nmemb = (char *)0x0;
  do {
    __nmemb = __nmemb + (*pprVar7 != (rx__test_case_desc *)0x0);
    pprVar7 = pprVar7 + 1;
  } while (pprVar7 != (rx__test_case_desc **)&__stop_rxcase);
  if (__nmemb == (char *)0x0) {
    iVar5 = 0;
    rx__log(RX_LOG_LEVEL_INFO,(char *)argv,0x148f,"nothing to run\n");
  }
  else {
    __base = malloc((long)__nmemb * 0x38);
    if (__base == (void *)0x0) {
      rx__log(RX_LOG_LEVEL_ERROR,(char *)argv,0x14ed,"failed to allocate the test cases\n");
      iVar5 = 1;
    }
    else {
      pprVar7 = &rx__dummy_case;
      local_50 = (char *)0x0;
      local_38 = (long)__nmemb * 0x38;
      do {
        prVar1 = *pprVar7;
        if (prVar1 != (rx__test_case_desc *)0x0) {
          pprVar19 = &rx__dummy_suite;
          do {
            puVar8 = &(*pprVar19)->name;
            if ((puVar8 != (undefined8 *)0x0) &&
               (iVar5 = strcmp((char *)*puVar8,prVar1->suite_name), iVar5 == 0)) {
              local_48 = (char *)0x0;
              prStack_40 = (rx__fixture_desc *)0x0;
              if ((undefined8 *)puVar8[1] != (undefined8 *)0x0) {
                (**(code **)puVar8[1])(&local_48);
              }
              goto LAB_00102415;
            }
            pprVar19 = (rx__test_suite_desc **)((long)pprVar19 + 8);
          } while ((eh_frame_hdr *)pprVar19 != &__stop_rxsuite);
          local_48 = (char *)0x0;
          prStack_40 = (rx__fixture_desc *)0x0;
LAB_00102415:
          if (prVar1->config_desc != (rx__test_case_config_desc *)0x0) {
            (*prVar1->config_desc->update)((rx__test_case_config_blueprint *)&local_48);
          }
          lVar15 = (long)local_50 * 0x38;
          pcVar14 = prVar1->name;
          *(undefined8 *)((long)__base + lVar15) = prVar1->suite_name;
          ((undefined8 *)((long)__base + lVar15))[1] = pcVar14;
          *(rx_run_fn *)((long)__base + lVar15 + 0x10) = prVar1->run;
          *(int *)((long)__base + lVar15 + 0x18) = (int)local_48;
          puVar8 = (undefined8 *)((long)__base + lVar15 + 0x20);
          *puVar8 = 0;
          puVar8[1] = 0;
          *(undefined8 *)((long)__base + lVar15 + 0x30) = 0;
          if (prStack_40 != (rx__fixture_desc *)0x0) {
            *(rx_size *)((long)__base + lVar15 + 0x20) = prStack_40->size;
            if (prStack_40->update != (rx__fixture_config_update_fn)0x0) {
              (*prStack_40->update)((rx_fixture_config *)((long)__base + lVar15 + 0x28));
            }
          }
          local_50 = local_50 + 1;
        }
        pprVar7 = pprVar7 + 1;
      } while (pprVar7 != (rx__test_case_desc **)&__stop_rxcase);
      if (local_50 != __nmemb) {
        __assert_fail("i == *test_case_count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                      ,0x1a06,"void rx_enumerate_test_cases(rx_size *, struct rx_test_case *)");
      }
      pcVar14 = __nmemb;
      qsort(__base,(size_t)__nmemb,0x38,rx__compare_test_cases);
      __ptr = malloc(local_38);
      if (__ptr == (void *)0x0) {
        rx__log(RX_LOG_LEVEL_ALL,pcVar14,0x1498,"failed to allocate the summaries\n");
        iVar5 = 1;
      }
      else {
        pcVar18 = (char *)0x0;
        do {
          lVar15 = (long)pcVar18 * 0x38;
          if (*(long *)((long)__base + lVar15) == 0) {
            __assert_fail("test_case->suite_name != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                          ,0x14a5,
                          "enum rx_status rx__run_test_cases(size_t, const struct rx_test_case *)");
          }
          prVar13 = (rx_test_case *)((long)__base + lVar15);
          if (prVar13->name == (char *)0x0) {
            __assert_fail("test_case->name != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                          ,0x14a6,
                          "enum rx_status rx__run_test_cases(size_t, const struct rx_test_case *)");
          }
          summary = (rx_summary *)(lVar15 + (long)__ptr);
          summary->failure_count = 0;
          summary->failures = (rx_failure *)0x0;
          summary->error = (char *)0x0;
          summary->assessed_count = 0;
          summary->test_case = (rx_test_case *)0x0;
          *(undefined8 *)&summary->skipped = 0;
          summary->elapsed = 0;
          puVar8 = (undefined8 *)malloc(0x30);
          if (puVar8 == (undefined8 *)0x0) {
            rx__log(RX_LOG_LEVEL_ALL,pcVar14,0x120e,
                    "failed to reserve a large enough capacity for the test failure array (requested capacity: %lu)\n"
                    ,0);
            rx__log(RX_LOG_LEVEL_ERROR,pcVar14,0x18d0,
                    "failed to create the test failure array (suite: \"%s\", case: \"%s\")\n",
                    prVar13->suite_name,prVar13->name);
            rx__log(RX_LOG_LEVEL_ERROR,pcVar14,0x14ad,
                    "failed to initialize the summary (suite: \"%s\", case: \"%s\")\n",
                    prVar13->suite_name,prVar13->name);
            __nmemb = pcVar18;
LAB_00102892:
            iVar5 = 1;
            goto joined_r0x0010289a;
          }
          *puVar8 = 0;
          puVar8[1] = 1;
          summary->failures = (rx_failure *)(puVar8 + 2);
          summary->test_case = prVar13;
          pcVar18 = pcVar18 + 1;
          file = prVar13;
          rVar6 = rx_test_case_run(summary,prVar13);
          if (rVar6 != RX_SUCCESS) {
            rx__log(RX_LOG_LEVEL_ERROR,(char *)file,0x14b8,
                    "failed to run a test case (suite: \"%s\", case: \"%s\")\n",prVar13->suite_name,
                    prVar13->name);
            iVar5 = 1;
            __nmemb = pcVar18;
            goto LAB_0010277b;
          }
          prVar13 = summary->test_case;
          if (prVar13 == (rx_test_case *)0x0) {
            __assert_fail("summary->test_case != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                          ,0x18f6,"void rx_summary_print(const struct rx_summary *)");
          }
          if (prVar13->suite_name == (char *)0x0) {
            __assert_fail("summary->test_case->suite_name != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                          ,0x18f7,"void rx_summary_print(const struct rx_summary *)");
          }
          if (prVar13->name == (char *)0x0) {
            __assert_fail("summary->test_case->name != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                          ,0x18f8,"void rx_summary_print(const struct rx_summary *)");
          }
          if (summary->failures == (rx_failure *)0x0) {
            __assert_fail("summary->failures != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                          ,0x18f9,"void rx_summary_print(const struct rx_summary *)");
          }
          rVar2 = summary->failure_count;
          iVar5 = fileno(_stderr);
          iVar5 = isatty(iVar5);
          if (iVar5 == 0) {
            pcVar16 = "";
            local_48 = "";
          }
          else {
            rx__log_style_get_ansi_code(&local_48,(rVar2 == 0) + RX__LOG_STYLE_BRIGHT_RED);
            pcVar16 = "\x1b[0m";
          }
          pcVar9 = "FAILED";
          if (rVar2 == 0) {
            pcVar9 = "PASSED";
          }
          pcVar20 = summary->test_case->name;
          pcVar14 = "[%s%s%s] \"%s\" / \"%s\" (%f ms)\n";
          fprintf(_stderr,"[%s%s%s] \"%s\" / \"%s\" (%f ms)\n",
                  SUB84((((double)CONCAT44(0x45300000,(int)(summary->elapsed >> 0x20)) -
                         1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)summary->elapsed) - 4503599627370496.0)) *
                        1e-06,0),local_48,pcVar9,pcVar16,summary->test_case->suite_name,pcVar20);
          if (summary->failure_count != 0) {
            lVar15 = 0x18;
            uVar11 = 0;
            do {
              prVar3 = summary->failures;
              pcVar16 = *(char **)((long)prVar3 + lVar15 + -8);
              if (pcVar16 == (char *)0x0) {
                pcVar16 = "";
              }
              pcVar9 = *(char **)((long)&prVar3->file + lVar15);
              pcVar17 = "nonfatal";
              if (*(int *)((long)prVar3 + lVar15 + -0xc) == 1) {
                pcVar17 = "fatal";
              }
              if (pcVar9 == (char *)0x0) {
                pcVar14 = "%s:%d: %s test failure: %s\n";
              }
              else {
                pcVar14 = "%s:%d: %s test failure: %s\n%s\n";
                pcVar20 = pcVar9;
              }
              fprintf(_stderr,pcVar14,*(undefined8 *)((long)prVar3 + lVar15 + -0x18),
                      (ulong)*(uint *)((long)prVar3 + lVar15 + -0x10),pcVar17,pcVar16,pcVar20);
              uVar11 = uVar11 + 1;
              lVar15 = lVar15 + 0x20;
            } while (uVar11 < summary->failure_count);
          }
        } while (pcVar18 != __nmemb);
        pcVar14 = (char *)0x0;
        iVar5 = 0;
        do {
          lVar15 = *(long *)((long)__ptr + (long)pcVar14 * 0x38 + 0x20);
          if (lVar15 != 0) {
            piVar10 = (int *)(*(long *)((long)__ptr + (long)pcVar14 * 0x38 + 0x28) + 0xc);
            do {
              if (*piVar10 == 1) goto LAB_00102892;
              piVar10 = piVar10 + 8;
              lVar15 = lVar15 + -1;
            } while (lVar15 != 0);
          }
          pcVar14 = pcVar14 + 1;
        } while (pcVar14 != __nmemb);
LAB_0010277b:
        do {
          __nmemb = __nmemb + -1;
          lVar12 = (long)__nmemb * 0x38;
          lVar15 = *(long *)((long)__ptr + lVar12 + 0x28);
          if (lVar15 == 0) {
            __assert_fail("summary->failures != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                          ,0x18de,"void rx_summary_terminate(struct rx_summary *)");
          }
          if (*(long *)((long)__ptr + lVar12 + 0x20) != 0) {
            lVar15 = 0x18;
            uVar11 = 0;
            do {
              lVar4 = *(long *)((long)__ptr + lVar12 + 0x28);
              free(*(void **)(lVar4 + -0x18 + lVar15));
              free(*(void **)(lVar4 + -8 + lVar15));
              free(*(void **)(lVar4 + lVar15));
              uVar11 = uVar11 + 1;
              lVar15 = lVar15 + 0x20;
            } while (uVar11 < *(ulong *)((long)__ptr + lVar12 + 0x20));
            lVar15 = *(long *)((long)__ptr + lVar12 + 0x28);
          }
          free((void *)(lVar15 + -0x10));
joined_r0x0010289a:
        } while (__nmemb != (char *)0x0);
        free(__ptr);
      }
      free(__base);
    }
  }
  return iVar5;
}

Assistant:

int
main(
    int argc,
    const char **argv
)
{
    return rx_main(0, NULL, argc, argv) == RX_SUCCESS ? 0 : 1;
}